

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDComponentFilter *
ON_SubDComponentFilter::Create
          (ON_SubDComponentFilter *__return_storage_ptr__,bool bAcceptVertices,bool bAcceptEdges,
          bool bAcceptFaces)

{
  bool bAcceptFaces_local;
  bool bAcceptEdges_local;
  bool bAcceptVertices_local;
  
  ON_SubDComponentFilter(__return_storage_ptr__);
  if (!bAcceptVertices) {
    __return_storage_ptr__->m_bRejectVertices = true;
  }
  if (!bAcceptEdges) {
    __return_storage_ptr__->m_bRejectEdges = true;
  }
  if (!bAcceptFaces) {
    __return_storage_ptr__->m_bRejectFaces = true;
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_SubDComponentFilter ON_SubDComponentFilter::Create(
  bool bAcceptVertices,
  bool bAcceptEdges,
  bool bAcceptFaces
)
{
  ON_SubDComponentFilter f;
  if (false == bAcceptVertices)
    f.m_bRejectVertices = true;
  if (false == bAcceptEdges)
    f.m_bRejectEdges = true;
  if (false == bAcceptFaces)
    f.m_bRejectFaces = true;
  return f;
}